

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::WaitForIdle(DeviceContextVkImpl *this)

{
  RenderDeviceVkImpl *this_00;
  SoftwareQueueIndex QueueInd;
  string msg;
  
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
    FormatString<char[37]>(&msg,(char (*) [37])"Only immediate contexts can be idled");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"WaitForIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb3e);
    std::__cxx11::string::~string((string *)&msg);
  }
  Flush(this);
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  QueueInd = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::IdleCommandQueue(&this_00->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                     ,QueueInd,true);
  return;
}

Assistant:

void DeviceContextVkImpl::WaitForIdle()
{
    DEV_CHECK_ERR(!IsDeferred(), "Only immediate contexts can be idled");
    Flush();
    m_pDevice->IdleCommandQueue(GetCommandQueueId(), true);
}